

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void __thiscall
kratos::DeadCodeInstanceElimination::~DeadCodeInstanceElimination(DeadCodeInstanceElimination *this)

{
  IRVisitor::~IRVisitor(&this->super_IRVisitor);
  operator_delete(this,0x48);
  return;
}

Assistant:

void visit(Generator* generator) override {
        auto const& children = generator->get_child_generators();
        std::vector<std::shared_ptr<Generator>> remove_set;
        for (auto const& child : children) {
            if (child->get_port_names().empty()) {
                remove_set.emplace_back(child);
            }
        }
        for (auto const& child : remove_set) {
            generator->remove_child_generator(child);
        }
    }